

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall
crnlib::crn_comp::pack_color_endpoints_etc
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  unsigned_short *puVar4;
  symbol_codec *this_00;
  vector<unsigned_short> *in_RDX;
  symbol_codec *in_RSI;
  long in_RDI;
  uint32 c_1;
  uint32 e_1;
  uint32 _e_1;
  uint32 p_1;
  uint32 prev_endpoint_1;
  symbol_codec codec;
  static_huffman_data_model dm;
  uint32 c;
  uint32 e;
  uint32 _e;
  uint32 p;
  uint32 prev_endpoint;
  symbol_histogram hist;
  uint i;
  vector<unsigned_int> remapped_endpoints;
  undefined4 in_stack_fffffffffffffe38;
  uint in_stack_fffffffffffffe3c;
  symbol_codec *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  static_huffman_data_model *in_stack_fffffffffffffe50;
  symbol_codec *in_stack_fffffffffffffe60;
  uint local_14c;
  uint local_140;
  symbol_codec local_138;
  static_huffman_data_model local_a0;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  static_huffman_data_model *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffcf;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar5;
  uint i_00;
  symbol_codec *in_stack_ffffffffffffffd8;
  
  vector<unsigned_int>::size((vector<unsigned_int> *)(in_RDI + 0x14f0));
  vector<unsigned_int>::vector
            ((vector<unsigned_int> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
  uVar5 = 0;
  while( true ) {
    i_00 = uVar5;
    uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)(in_RDI + 0x14f0));
    if (uVar2 <= uVar5) break;
    puVar3 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 0x14f0),i_00);
    uVar5 = *puVar3;
    puVar3 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 0x14f0),i_00);
    uVar1 = *puVar3;
    puVar4 = vector<unsigned_short>::operator[](in_RDX,i_00);
    puVar3 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)&stack0xffffffffffffffd8,(uint)*puVar4);
    *puVar3 = uVar5 & 0x7000000 | uVar1 >> 3 & 0x1f1f1f;
    uVar5 = i_00 + 1;
  }
  symbol_histogram::symbol_histogram
            ((symbol_histogram *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
  local_54 = 0;
  local_58 = 0;
  while( true ) {
    uVar5 = local_58;
    uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)&stack0xffffffffffffffd8);
    if (uVar2 <= uVar5) break;
    local_5c = local_54;
    in_stack_fffffffffffffe60 =
         (symbol_codec *)
         vector<unsigned_int>::operator[]((vector<unsigned_int> *)&stack0xffffffffffffffd8,local_58)
    ;
    local_60 = *(uint *)&in_stack_fffffffffffffe60->m_pDecode_buf;
    local_54 = local_60;
    for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
      symbol_histogram::inc_freq
                ((symbol_histogram *)in_stack_fffffffffffffe50,
                 (uint)((ulong)in_stack_fffffffffffffe48 >> 0x20),(uint)in_stack_fffffffffffffe48);
      local_5c = local_5c >> 8;
      local_60 = local_60 >> 8;
    }
    local_58 = local_58 + 1;
  }
  static_huffman_data_model::static_huffman_data_model(in_stack_fffffffffffffe50);
  static_huffman_data_model::init(&local_a0,(EVP_PKEY_CTX *)0x1);
  symbol_codec::symbol_codec(in_stack_fffffffffffffe60);
  symbol_codec::start_encoding(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
  symbol_codec::encode_transmit_static_huffman_data_model
            (in_stack_ffffffffffffffd8,
             (static_huffman_data_model *)CONCAT44(i_00,in_stack_ffffffffffffffd0),
             (bool)in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc0);
  local_140 = 0;
  while( true ) {
    uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)&stack0xffffffffffffffd8);
    if (uVar2 <= local_140) break;
    this_00 = (symbol_codec *)
              vector<unsigned_int>::operator[]
                        ((vector<unsigned_int> *)&stack0xffffffffffffffd8,local_140);
    for (local_14c = 0; local_14c < 4; local_14c = local_14c + 1) {
      symbol_codec::encode
                (this_00,(uint)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                 (static_huffman_data_model *)in_stack_fffffffffffffe40);
    }
    local_140 = local_140 + 1;
  }
  symbol_codec::stop_encoding(in_stack_fffffffffffffe40,SUB41(in_stack_fffffffffffffe3c >> 0x18,0));
  symbol_codec::get_encoding_buf(&local_138);
  vector<unsigned_char>::swap
            ((vector<unsigned_char> *)in_RSI,
             (vector<unsigned_char> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38))
  ;
  symbol_codec::~symbol_codec(in_RSI);
  static_huffman_data_model::~static_huffman_data_model((static_huffman_data_model *)in_RSI);
  symbol_histogram::~symbol_histogram((symbol_histogram *)0x1c8a56);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)in_RSI);
  return true;
}

Assistant:

bool crn_comp::pack_color_endpoints_etc(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping) {
  crnlib::vector<uint32> remapped_endpoints(m_color_endpoints.size());
  for (uint i = 0; i < m_color_endpoints.size(); i++)
    remapped_endpoints[remapping[i]] = (m_color_endpoints[i] & 0x07000000) | (m_color_endpoints[i] >> 3 & 0x001F1F1F);

  symbol_histogram hist(32);
  for (uint32 prev_endpoint = 0, p = 0; p < remapped_endpoints.size(); p++) {
    for (uint32 _e = prev_endpoint, e = prev_endpoint = remapped_endpoints[p], c = 0; c < 4; c++, _e >>= 8, e >>= 8)
      hist.inc_freq((e - _e) & 0x1F);
  }
  static_huffman_data_model dm;
  dm.init(true, hist, 15);
  symbol_codec codec;
  codec.start_encoding(1024 * 1024);
  codec.encode_transmit_static_huffman_data_model(dm, false);
  for (uint32 prev_endpoint = 0, p = 0; p < remapped_endpoints.size(); p++) {
    for (uint32 _e = prev_endpoint, e = prev_endpoint = remapped_endpoints[p], c = 0; c < 4; c++, _e >>= 8, e >>= 8)
      codec.encode((e - _e) & 0x1F, dm);
  }
  codec.stop_encoding(false);
  packed_data.swap(codec.get_encoding_buf());
  return true;
}